

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O3

asn_dec_rval_t
OCTET_STRING_decode_uper
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
          asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  size_t units;
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  undefined8 uVar4;
  long *plVar5;
  uint8_t *puVar6;
  ssize_t sVar7;
  void *pvVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  asn_per_constraint_s *paVar12;
  asn_OCTET_STRING_specifics_t *paVar13;
  asn_OS_Subvariant aVar14;
  ulong uVar15;
  ulong uVar16;
  asn_per_constraints_t *paVar17;
  asn_dec_rval_t aVar18;
  int repeat;
  asn_per_constraints_t *local_50;
  ulong local_48;
  ulong local_40;
  size_t local_38;
  
  paVar13 = &asn_DEF_OCTET_STRING_specs;
  if ((asn_OCTET_STRING_specifics_t *)td->specifics != (asn_OCTET_STRING_specifics_t *)0x0) {
    paVar13 = (asn_OCTET_STRING_specifics_t *)td->specifics;
  }
  if (constraints == (asn_per_constraints_t *)0x0) {
    constraints = td->per_constraints;
  }
  paVar17 = constraints;
  if (constraints == (asn_per_constraints_t *)0x0) {
    paVar17 = &asn_DEF_OCTET_STRING_constraints;
  }
  paVar12 = &paVar17->size;
  aVar14 = paVar13->subvariant;
  uVar15 = (ulong)aVar14;
  sVar10 = 0;
  uVar4 = 2;
  if (3 < aVar14 - ASN_OSUBV_BIT) goto LAB_00147f6a;
  plVar5 = (long *)*sptr;
  switch(aVar14) {
  case ASN_OSUBV_BIT:
    bVar1 = true;
    break;
  case ASN_OSUBV_STR:
    uVar15 = 8;
    sVar10 = 1;
    if (((paVar17->value).flags & APC_CONSTRAINED) == APC_UNCONSTRAINED) {
      bVar1 = false;
      aVar14 = 8;
    }
    else {
LAB_00147d1f:
      aVar14 = (asn_OS_Subvariant)uVar15;
      uVar15 = (ulong)(uint)(paVar17->value).range_bits;
      bVar1 = false;
    }
    break;
  case ASN_OSUBV_U16:
    uVar15 = 0x10;
    sVar10 = 2;
    if (((paVar17->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) goto LAB_00147d1f;
    bVar1 = false;
    aVar14 = 0x10;
    break;
  case ASN_OSUBV_U32:
    uVar15 = 0x20;
    sVar10 = 4;
    if (((paVar17->value).flags & APC_CONSTRAINED) != APC_UNCONSTRAINED) goto LAB_00147d1f;
    bVar1 = false;
    aVar14 = 0x20;
  }
  local_50 = constraints;
  if (plVar5 == (long *)0x0) {
    plVar5 = (long *)calloc(1,(long)paVar13->struct_size);
    *sptr = plVar5;
    if (plVar5 != (long *)0x0) goto LAB_00147d5b;
LAB_00147f03:
    sVar10 = 0;
    uVar4 = 2;
    goto LAB_00147f6a;
  }
LAB_00147d5b:
  if (((paVar17->size).flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
    iVar2 = per_get_few_bits(pd,1);
    if (iVar2 != 0) {
      paVar12 = &asn_DEF_OCTET_STRING_constraints.size;
    }
    if (iVar2 != 0) {
      paVar17 = &asn_DEF_OCTET_STRING_constraints;
      uVar15 = (ulong)aVar14;
    }
    if (-1 < iVar2) goto LAB_00147d9e;
LAB_00147f0e:
    sVar10 = 0;
    uVar4 = 1;
    goto LAB_00147f6a;
  }
LAB_00147d9e:
  uVar3 = (uint)sVar10;
  if (paVar12->effective_bits < 0) {
LAB_00147df3:
    *(undefined4 *)(plVar5 + 1) = 0;
    local_48 = uVar15;
    local_40 = uVar15;
    local_38 = sVar10;
    do {
      sVar7 = uper_get_length(pd,paVar12->effective_bits,&repeat);
      if (sVar7 < 0) goto LAB_00147f63;
      uVar15 = sVar7 + paVar12->lower_bound;
      if (bVar1) {
        lVar11 = (long)(uVar15 + 7) >> 3;
        uVar16 = uVar15;
        if ((uVar15 & 7) != 0) {
          *(int *)((long)plVar5 + 0xc) = 8 - (int)(uVar15 & 7);
        }
      }
      else {
        lVar11 = uVar15 * local_38;
        uVar16 = lVar11 * local_40;
      }
      pvVar8 = realloc((void *)*plVar5,lVar11 + (int)plVar5[1] + 1);
      if (pvVar8 == (void *)0x0) goto LAB_00147f03;
      *plVar5 = (long)pvVar8;
      puVar6 = (uint8_t *)((long)(int)plVar5[1] + (long)pvVar8);
      if (bVar1) {
        iVar9 = per_get_many_bits(pd,puVar6,0,(int)uVar16);
      }
      else {
        iVar9 = OCTET_STRING_per_get_characters
                          (pd,puVar6,uVar15,uVar3,(uint)local_48,(paVar17->value).lower_bound,
                           (paVar17->value).upper_bound,local_50);
        if (0 < iVar9) goto LAB_00147f03;
      }
      if (iVar9 < 0) goto LAB_00147f63;
      iVar9 = (int)lVar11 + (int)plVar5[1];
      *(int *)(plVar5 + 1) = iVar9;
    } while (repeat != 0);
    *(undefined1 *)(*plVar5 + (long)iVar9) = 0;
    uVar4 = 0;
LAB_00147f68:
    sVar10 = 0;
  }
  else {
    free((void *)*plVar5);
    units = paVar12->upper_bound;
    iVar9 = uVar3 * (int)units;
    if (bVar1) {
      iVar9 = (int)(units + 7 >> 3);
    }
    *(int *)(plVar5 + 1) = iVar9;
    puVar6 = (uint8_t *)malloc((long)(iVar9 + 1));
    *plVar5 = (long)puVar6;
    if (puVar6 == (uint8_t *)0x0) {
      *(undefined4 *)(plVar5 + 1) = 0;
      goto LAB_00147f03;
    }
    if (paVar12->effective_bits != 0) goto LAB_00147df3;
    if (bVar1) {
      iVar9 = per_get_many_bits(pd,puVar6,0,(int)units * (uint)uVar15);
      if (iVar9 < 0) {
LAB_00147f63:
        uVar4 = 1;
        goto LAB_00147f68;
      }
      lVar11 = paVar12->upper_bound;
      *(undefined1 *)(*plVar5 + (long)(int)plVar5[1]) = 0;
      uVar3 = (uint)paVar12->upper_bound & 7;
      iVar9 = 8 - uVar3;
      if (uVar3 == 0) {
        iVar9 = 0;
      }
      *(int *)((long)plVar5 + 0xc) = iVar9;
    }
    else {
      iVar9 = OCTET_STRING_per_get_characters
                        (pd,puVar6,units,uVar3,(uint)uVar15,(paVar17->value).lower_bound,
                         (paVar17->value).upper_bound,local_50);
      if (0 < iVar9) goto LAB_00147f03;
      if (iVar9 < 0) goto LAB_00147f0e;
      lVar11 = paVar12->upper_bound;
      *(undefined1 *)(*plVar5 + (long)(int)plVar5[1]) = 0;
    }
    sVar10 = uVar15 * lVar11;
    uVar4 = 0;
  }
LAB_00147f6a:
  aVar18.consumed = sVar10;
  aVar18._0_8_ = uVar4;
  return aVar18;
}

Assistant:

asn_dec_rval_t
OCTET_STRING_decode_uper(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td, asn_per_constraints_t *constraints,
	void **sptr, asn_per_data_t *pd) {

	asn_OCTET_STRING_specifics_t *specs = td->specifics
		? (asn_OCTET_STRING_specifics_t *)td->specifics
		: &asn_DEF_OCTET_STRING_specs;
	asn_per_constraints_t *pc = constraints ? constraints
				: td->per_constraints;
	asn_per_constraint_t *cval;
	asn_per_constraint_t *csiz;
	asn_dec_rval_t rval = { RC_OK, 0 };
	BIT_STRING_t *st = (BIT_STRING_t *)*sptr;
	ssize_t consumed_myself = 0;
	int repeat;
	enum {
		OS__BPC_BIT	= 0,
		OS__BPC_CHAR	= 1,
		OS__BPC_U16	= 2,
		OS__BPC_U32	= 4
	} bpc;	/* Bytes per character */
	unsigned int unit_bits;
	unsigned int canonical_unit_bits;

	(void)opt_codec_ctx;

	if(pc) {
		cval = &pc->value;
		csiz = &pc->size;
	} else {
		cval = &asn_DEF_OCTET_STRING_constraints.value;
		csiz = &asn_DEF_OCTET_STRING_constraints.size;
	}

	switch(specs->subvariant) {
	default:
	case ASN_OSUBV_ANY:
		ASN_DEBUG("Unrecognized subvariant %d", specs->subvariant);
		RETURN(RC_FAIL);
	case ASN_OSUBV_BIT:
		canonical_unit_bits = unit_bits = 1;
		bpc = OS__BPC_BIT;
		break;
	case ASN_OSUBV_STR:
		canonical_unit_bits = unit_bits = 8;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_CHAR;
		break;
	case ASN_OSUBV_U16:
		canonical_unit_bits = unit_bits = 16;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U16;
		break;
	case ASN_OSUBV_U32:
		canonical_unit_bits = unit_bits = 32;
		if(cval->flags & APC_CONSTRAINED)
			unit_bits = cval->range_bits;
		bpc = OS__BPC_U32;
		break;
	}

	/*
	 * Allocate the string.
	 */
	if(!st) {
		st = (BIT_STRING_t *)(*sptr = CALLOC(1, specs->struct_size));
		if(!st) RETURN(RC_FAIL);
	}

	ASN_DEBUG("PER Decoding %s size %ld .. %ld bits %d",
		csiz->flags & APC_EXTENSIBLE ? "extensible" : "non-extensible",
		csiz->lower_bound, csiz->upper_bound, csiz->effective_bits);

	if(csiz->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) RETURN(RC_WMORE);
		if(inext) {
			csiz = &asn_DEF_OCTET_STRING_constraints.size;
			cval = &asn_DEF_OCTET_STRING_constraints.value;
			unit_bits = canonical_unit_bits;
		}
	}

	if(csiz->effective_bits >= 0) {
		FREEMEM(st->buf);
		if(bpc) {
			st->size = csiz->upper_bound * bpc;
		} else {
			st->size = (csiz->upper_bound + 7) >> 3;
		}
		st->buf = (uint8_t *)MALLOC(st->size + 1);
		if(!st->buf) { st->size = 0; RETURN(RC_FAIL); }
	}

	/* X.691, #16.5: zero-length encoding */
	/* X.691, #16.6: short fixed length encoding (up to 2 octets) */
	/* X.691, #16.7: long fixed length encoding (up to 64K octets) */
	if(csiz->effective_bits == 0) {
		int ret;
		if(bpc) {
			ASN_DEBUG("Encoding OCTET STRING size %ld",
				csiz->upper_bound);
			ret = OCTET_STRING_per_get_characters(pd, st->buf,
				csiz->upper_bound, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
			if(ret > 0) RETURN(RC_FAIL);
		} else {
			ASN_DEBUG("Encoding BIT STRING size %ld",
				csiz->upper_bound);
			ret = per_get_many_bits(pd, st->buf, 0,
					    unit_bits * csiz->upper_bound);
		}
		if(ret < 0) RETURN(RC_WMORE);
		consumed_myself += unit_bits * csiz->upper_bound;
		st->buf[st->size] = 0;
		if(bpc == 0) {
			int ubs = (csiz->upper_bound & 0x7);
			st->bits_unused = ubs ? 8 - ubs : 0;
		}
		RETURN(RC_OK);
	}

	st->size = 0;
	do {
		ssize_t raw_len;
		ssize_t len_bytes;
		ssize_t len_bits;
		void *p;
		int ret;

		/* Get the PER length */
		raw_len = uper_get_length(pd, csiz->effective_bits, &repeat);
		if(raw_len < 0) RETURN(RC_WMORE);
		raw_len += csiz->lower_bound;

		ASN_DEBUG("Got PER length eb %ld, len %ld, %s (%s)",
			(long)csiz->effective_bits, (long)raw_len,
			repeat ? "repeat" : "once", td->name);
		if(bpc) {
			len_bytes = raw_len * bpc;
			len_bits = len_bytes * unit_bits;
		} else {
			len_bits = raw_len;
			len_bytes = (len_bits + 7) >> 3;
			if(len_bits & 0x7)
				st->bits_unused = 8 - (len_bits & 0x7);
			/* len_bits be multiple of 16K if repeat is set */
		}
		p = REALLOC(st->buf, st->size + len_bytes + 1);
		if(!p) RETURN(RC_FAIL);
		st->buf = (uint8_t *)p;

		if(bpc) {
			ret = OCTET_STRING_per_get_characters(pd,
				&st->buf[st->size], raw_len, bpc, unit_bits,
				cval->lower_bound, cval->upper_bound, pc);
			if(ret > 0) RETURN(RC_FAIL);
		} else {
			ret = per_get_many_bits(pd, &st->buf[st->size],
				0, len_bits);
		}
		if(ret < 0) RETURN(RC_WMORE);
		st->size += len_bytes;
	} while(repeat);
	st->buf[st->size] = 0;	/* nul-terminate */

	return rval;
}